

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::RangeSink::AddOutput(RangeSink *this,DualMap *map,NameMunger *munger)

{
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  *this_00;
  long in_RDI;
  value_type *in_stack_ffffffffffffffc8;
  
  this_00 = (vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             *)(in_RDI + 0xf8);
  std::make_pair<bloaty::DualMap*&,bloaty::NameMunger_const*&>
            ((DualMap **)this_00,(NameMunger **)in_stack_ffffffffffffffc8);
  std::
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  ::push_back(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void RangeSink::AddOutput(DualMap* map, const NameMunger* munger) {
  outputs_.push_back(std::make_pair(map, munger));
}